

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_MergeSortCost_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int local_34;
  int local_30;
  int best_i;
  int j;
  int i;
  int temp;
  int nSize;
  int *pOutBeg_local;
  int *pInEnd_local;
  int *pInBeg_local;
  
  auVar2._8_8_ = (long)pInEnd - (long)pInBeg >> 0x3f;
  auVar2._0_8_ = (long)pInEnd - (long)pInBeg >> 2;
  iVar3 = SUB164(auVar2 / SEXT816(2),0);
  if (iVar3 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                  ,0xba,"void Abc_MergeSortCost_rec(int *, int *, int *)");
  }
  if (iVar3 != 1) {
    if (iVar3 == 2) {
      if (pInBeg[3] < pInBeg[1]) {
        pInBeg[1] = pInBeg[3] ^ pInBeg[1];
        pInBeg[3] = pInBeg[1] ^ pInBeg[3];
        pInBeg[1] = pInBeg[3] ^ pInBeg[1];
        *pInBeg = pInBeg[2] ^ *pInBeg;
        pInBeg[2] = *pInBeg ^ pInBeg[2];
        *pInBeg = pInBeg[2] ^ *pInBeg;
      }
    }
    else if (iVar3 < 8) {
      for (best_i = 0; best_i < iVar3 + -1; best_i = best_i + 1) {
        local_34 = best_i;
        local_30 = best_i;
        while (local_30 = local_30 + 1, local_30 < iVar3) {
          if (pInBeg[local_30 * 2 + 1] < pInBeg[local_34 * 2 + 1]) {
            local_34 = local_30;
          }
        }
        iVar1 = pInBeg[best_i << 1];
        pInBeg[best_i << 1] = pInBeg[local_34 << 1];
        pInBeg[local_34 << 1] = iVar1;
        iVar1 = pInBeg[best_i * 2 + 1];
        pInBeg[best_i * 2 + 1] = pInBeg[local_34 * 2 + 1];
        pInBeg[local_34 * 2 + 1] = iVar1;
      }
    }
    else {
      Abc_MergeSortCost_rec(pInBeg,pInBeg + (iVar3 / 2 << 1),pOutBeg);
      Abc_MergeSortCost_rec(pInBeg + (iVar3 / 2 << 1),pInEnd,pOutBeg + (iVar3 / 2 << 1));
      Abc_MergeSortCostMerge
                (pInBeg,pInBeg + (iVar3 / 2 << 1),pInBeg + (iVar3 / 2 << 1),pInEnd,pOutBeg);
      memcpy(pInBeg,pOutBeg,(long)iVar3 << 3);
    }
  }
  return;
}

Assistant:

void Abc_MergeSortCost_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = (pInEnd - pInBeg)/2;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[1] > pInBeg[3] )
         {
             pInBeg[1] ^= pInBeg[3];
             pInBeg[3] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[3];
             pInBeg[0] ^= pInBeg[2];
             pInBeg[2] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[2];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[2*j+1] < pInBeg[2*best_i+1] )
                    best_i = j;
            temp = pInBeg[2*i]; 
            pInBeg[2*i] = pInBeg[2*best_i]; 
            pInBeg[2*best_i] = temp;
            temp = pInBeg[2*i+1]; 
            pInBeg[2*i+1] = pInBeg[2*best_i+1]; 
            pInBeg[2*best_i+1] = temp;
        }
    }
    else
    {
        Abc_MergeSortCost_rec( pInBeg, pInBeg + 2*(nSize/2), pOutBeg );
        Abc_MergeSortCost_rec( pInBeg + 2*(nSize/2), pInEnd, pOutBeg + 2*(nSize/2) );
        Abc_MergeSortCostMerge( pInBeg, pInBeg + 2*(nSize/2), pInBeg + 2*(nSize/2), pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * 2 * nSize );
    }
}